

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::PrimitiveRestartTest::createBufferData
          (PrimitiveRestartTest *this,VkPrimitiveTopology topology,int primitiveCount,
          VkIndexType indexType,vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexData)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  value_type_conflict1 local_28c;
  value_type_conflict1 local_288;
  undefined1 local_284 [8];
  Vertex4RGBA vertex_8;
  undefined1 local_25c [8];
  Vertex4RGBA vertex_9;
  int vertexNdx_1;
  value_type_conflict1 local_230;
  int primitiveNdx_4;
  undefined1 local_228 [8];
  Vertex4RGBA vertex_6;
  Vertex4RGBA vertex_7;
  value_type_conflict1 local_1dc;
  int local_1d8;
  value_type_conflict1 local_1d4;
  int primitiveNdx_3;
  Vertex4RGBA vertex_4;
  float fStack_1a8;
  value_type_conflict1 local_19c;
  undefined1 auStack_198 [8];
  Vertex4RGBA vertex_5;
  int primitiveNdx_2;
  float stepAngle;
  Vertex4RGBA vertex_2;
  Vertex4RGBA vertex_3;
  int vertexNdx;
  value_type_conflict1 local_118;
  int primitiveNdx_1;
  Vertex4RGBA vertex;
  Vertex4RGBA vertex_1;
  int local_bc;
  undefined1 local_b8 [4];
  int primitiveNdx;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  float fStack_80;
  bool primitiveStart;
  float primitiveSizeX;
  float primitiveSizeY;
  Vertex4RGBA defaultVertex;
  float originY;
  float originX;
  float border;
  Vec4 green;
  Vec4 red;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertexData_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData_local;
  VkIndexType indexType_local;
  int primitiveCount_local;
  VkPrimitiveTopology topology_local;
  PrimitiveRestartTest *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&originX,0.0,1.0,0.0,1.0);
  defaultVertex.color.m_data[3] = -0.8;
  defaultVertex.color.m_data[2] = -0.8;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&primitiveSizeX,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(defaultVertex.position.m_data + 2),(Vector<float,_4> *)&originX);
  fStack_80 = 1.6;
  bVar2 = true;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             local_b8);
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1.6 / (float)(primitiveCount / 2);
    break;
  default:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         1.6 / (float)(primitiveCount / 2 + primitiveCount % 2);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0.8;
    fStack_80 = 0.8;
  }
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    for (local_bc = 0; local_bc < primitiveCount; local_bc = local_bc + 1) {
      bVar3 = isRestartPrimitive(this,local_bc);
      if (bVar3) {
        vertex_1.color.m_data[2] = (float)InputAssemblyTest::getRestartIndex(indexType);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)(vertex_1.color.m_data + 2));
        bVar2 = true;
      }
      else {
        if (bVar2) {
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex.color.m_data + 3),
                     (float)(local_bc / 2) *
                     indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                     (float)(local_bc % 2) * fStack_80 + -0.8,0.0,1.0);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex_1.position.m_data + 2),
                     (Vector<float,_4> *)(green.m_data + 2));
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)local_b8,(value_type *)(vertex.color.m_data + 3));
          sVar4 = std::
                  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
                  size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
          vertex.color.m_data[2] = (float)((int)sVar4 + -1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict1 *)(vertex.color.m_data + 2));
          bVar2 = false;
        }
        uVar1 = (local_bc + 1) - (local_bc + 1 >> 0x1f);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)&primitiveNdx_1,
                   (float)((int)uVar1 >> 1) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(int)((local_bc + 1) - (uVar1 & 0xfffffffe)) * fStack_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )local_b8,(value_type *)&primitiveNdx_1);
        sVar4 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ::size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
        local_118 = (int)sVar4 - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_118);
      }
    }
    break;
  default:
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    for (vertexNdx = 0; vertexNdx < primitiveCount; vertexNdx = vertexNdx + 1) {
      bVar3 = isRestartPrimitive(this,vertexNdx);
      if (bVar3) {
        vertex_3.color.m_data[3] = (float)InputAssemblyTest::getRestartIndex(indexType);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)(vertex_3.color.m_data + 3));
        bVar2 = true;
      }
      else {
        if (bVar2) {
          for (vertex_3.color.m_data[2] = 0.0; (int)vertex_3.color.m_data[2] < 2;
              vertex_3.color.m_data[2] = (float)((int)vertex_3.color.m_data[2] + 1)) {
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(vertex_2.color.m_data + 3),
                       (float)((vertexNdx + (int)vertex_3.color.m_data[2]) / 2) *
                       indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                       (float)((vertexNdx + (int)vertex_3.color.m_data[2]) % 2) * fStack_80 + -0.8,
                       0.0,1.0);
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(vertex_3.position.m_data + 2),
                       (Vector<float,_4> *)(green.m_data + 2));
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       *)local_b8,(value_type *)(vertex_2.color.m_data + 3));
            sVar4 = std::
                    vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ::size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            *)local_b8);
            vertex_2.color.m_data[2] = (float)((int)sVar4 + -1);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &vertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (value_type_conflict1 *)(vertex_2.color.m_data + 2));
          }
          bVar2 = false;
        }
        uVar1 = (vertexNdx + 2) - (vertexNdx + 2 >> 0x1f);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)&stepAngle,
                   (float)((int)uVar1 >> 1) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(int)((vertexNdx + 2) - (uVar1 & 0xfffffffe)) * fStack_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_2.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )local_b8,(value_type *)&stepAngle);
        sVar4 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ::size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
        primitiveNdx_2 = (int)sVar4 + -1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)&primitiveNdx_2);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    fVar5 = de::min<float>(1.5707964,6.2831855 / (float)primitiveCount);
    for (vertex_5.color.m_data[3] = 0.0; (int)vertex_5.color.m_data[3] < primitiveCount;
        vertex_5.color.m_data[3] = (float)((int)vertex_5.color.m_data[3] + 1)) {
      bVar3 = isRestartPrimitive(this,(int)vertex_5.color.m_data[3]);
      if (bVar3) {
        vertex_5.color.m_data[2] = (float)InputAssemblyTest::getRestartIndex(indexType);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)(vertex_5.color.m_data + 2));
        bVar2 = true;
      }
      else {
        if (bVar2) {
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_198,0.0,0.0,0.0,1.0);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex_5.position.m_data + 2),
                     (Vector<float,_4> *)(green.m_data + 2));
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)local_b8,(value_type *)auStack_198);
          sVar4 = std::
                  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
                  size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
          local_19c = (int)sVar4 - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_19c);
          fVar6 = deFloatCos(fVar5 * (float)(int)vertex_5.color.m_data[3]);
          fVar7 = deFloatSin(fVar5 * (float)(int)vertex_5.color.m_data[3]);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex_4.color.m_data + 3),
                     indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_ * fVar6,fStack_80 * fVar7,0.0,
                     1.0);
          auStack_198._0_4_ = vertex_4.color.m_data[3];
          auStack_198._4_4_ = fStack_1a8;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)local_b8,(value_type *)auStack_198);
          sVar4 = std::
                  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
                  size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
          vertex_4.color.m_data[2] = (float)((int)sVar4 + -1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict1 *)(vertex_4.color.m_data + 2));
          bVar2 = false;
        }
        fVar6 = deFloatCos(fVar5 * (float)((int)vertex_5.color.m_data[3] + 1));
        fVar7 = deFloatSin(fVar5 * (float)((int)vertex_5.color.m_data[3] + 1));
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)&primitiveNdx_3,
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ * fVar6,fStack_80 * fVar7,0.0,1.0
                  );
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_4.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )local_b8,(value_type *)&primitiveNdx_3);
        sVar4 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ::size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
        local_1d4 = (int)sVar4 - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d4);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               local_b8,(value_type *)&primitiveSizeX);
    for (local_1d8 = 0; local_1d8 < primitiveCount; local_1d8 = local_1d8 + 1) {
      bVar3 = isRestartPrimitive(this,local_1d8);
      if (bVar3) {
        local_1dc = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1dc);
        vertex_7.color.m_data[3] = (float)InputAssemblyTest::getRestartIndex(indexType);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)(vertex_7.color.m_data + 3));
        bVar2 = true;
      }
      else {
        if (bVar2) {
          vertex_7.color.m_data[2] = 0.0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict1 *)(vertex_7.color.m_data + 2));
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex_6.color.m_data + 3),
                     (float)(local_1d8 / 2) *
                     indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                     (float)(local_1d8 % 2) * fStack_80 + -0.8,0.0,1.0);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex_7.position.m_data + 2),
                     (Vector<float,_4> *)(green.m_data + 2));
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)local_b8,(value_type *)(vertex_6.color.m_data + 3));
          sVar4 = std::
                  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
                  size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
          vertex_6.color.m_data[2] = (float)((int)sVar4 + -1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict1 *)(vertex_6.color.m_data + 2));
          bVar2 = false;
        }
        uVar1 = (local_1d8 + 1) - (local_1d8 + 1 >> 0x1f);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)local_228,
                   (float)((int)uVar1 >> 1) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(int)((local_1d8 + 1) - (uVar1 & 0xfffffffe)) * fStack_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_6.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )local_b8,(value_type *)local_228);
        sVar4 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ::size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
        primitiveNdx_4 = (int)sVar4 + -1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)&primitiveNdx_4);
      }
    }
    local_230 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_230);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               local_b8,(value_type *)&primitiveSizeX);
    for (vertexNdx_1 = 0; vertexNdx_1 < primitiveCount; vertexNdx_1 = vertexNdx_1 + 1) {
      bVar3 = isRestartPrimitive(this,vertexNdx_1);
      if (bVar3) {
        vertex_9.color.m_data[3] = (float)InputAssemblyTest::getRestartIndex(indexType);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)(vertex_9.color.m_data + 3));
        bVar2 = true;
      }
      else {
        if (bVar2) {
          for (vertex_9.color.m_data[2] = 0.0; (int)vertex_9.color.m_data[2] < 2;
              vertex_9.color.m_data[2] = (float)((int)vertex_9.color.m_data[2] + 1)) {
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)local_25c,
                       (float)((vertexNdx_1 + (int)vertex_9.color.m_data[2]) / 2) *
                       indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                       (float)((vertexNdx_1 + (int)vertex_9.color.m_data[2]) % 2) * fStack_80 + -0.8
                       ,0.0,1.0);
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)(vertex_9.position.m_data + 2),
                       (Vector<float,_4> *)(green.m_data + 2));
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       *)local_b8,(value_type *)local_25c);
            sVar4 = std::
                    vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ::size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            *)local_b8);
            vertex_8.color.m_data[3] = (float)((int)sVar4 + -1);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &vertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (value_type_conflict1 *)(vertex_8.color.m_data + 3));
            vertex_8.color.m_data[2] = 0.0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &vertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (value_type_conflict1 *)(vertex_8.color.m_data + 2));
          }
          bVar2 = false;
        }
        uVar1 = (vertexNdx_1 + 2) - (vertexNdx_1 + 2 >> 0x1f);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)local_284,
                   (float)((int)uVar1 >> 1) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(int)((vertexNdx_1 + 2) - (uVar1 & 0xfffffffe)) * fStack_80 + -0.8,0.0,1.0
                  );
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_8.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )local_b8,(value_type *)local_284);
        sVar4 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ::size((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        *)local_b8);
        local_288 = (int)sVar4 - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_288);
        local_28c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_28c);
      }
    }
  }
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (vertexData,
             (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             local_b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (indexData,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             local_b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void PrimitiveRestartTest::createBufferData (VkPrimitiveTopology topology, int primitiveCount, VkIndexType indexType, std::vector<deUint32>& indexData, std::vector<Vertex4RGBA>& vertexData) const
{
	DE_ASSERT(primitiveCount > 0);
	DE_UNREF(indexType);

	const tcu::Vec4				red						(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4				green					(0.0f, 1.0f, 0.0f, 1.0f);
	const float					border					= 0.2f;
	const float					originX					= -1.0f + border;
	const float					originY					= -1.0f + border;
	const Vertex4RGBA			defaultVertex			= { tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), green };
	float						primitiveSizeY			= (2.0f - 2.0f * border);
	float						primitiveSizeX;
	bool						primitiveStart			= true;
	std::vector<deUint32>		indices;
	std::vector<Vertex4RGBA>	vertices;


	// Calculate primitive size
	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			primitiveSizeX = 1.0f - border;
			primitiveSizeY = 1.0f - border;
			break;

		default:
			primitiveSizeX = 0.0f; // Garbage
			DE_ASSERT(false);
	}

	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
						{
							const Vertex4RGBA vertex =
							{
								tcu::Vec4(originX + float((primitiveNdx + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx + vertexNdx) % 2) * primitiveSizeY, 0.0f, 1.0f),
								red
							};

							vertices.push_back(vertex);
							indices.push_back((deUint32)vertices.size() - 1);
						}

						primitiveStart = false;
					}
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		{
			const float stepAngle = de::min(DE_PI * 0.5f, (2 * DE_PI) / float(primitiveCount));

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						Vertex4RGBA vertex =
						{
							tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						vertex.position = tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx)), 0.0f, 1.0f),
						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx + 1)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx + 1)), 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(0);
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						indices.push_back(0);

						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}

			indices.push_back(0);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
						{
							const Vertex4RGBA vertex =
							{
								tcu::Vec4(originX + float((primitiveNdx + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx + vertexNdx) % 2) * primitiveSizeY, 0.0f, 1.0f),
								red
							};

							vertices.push_back(vertex);
							indices.push_back((deUint32)vertices.size() - 1);
							indices.push_back(0);
						}

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
					indices.push_back(0);
				}
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	vertexData	= vertices;
	indexData	= indices;
}